

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_on_priority_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  uint uVar1;
  uint *puVar2;
  nghttp2_on_frame_recv_callback p_Var3;
  uint8_t u8extpri;
  int iVar4;
  nghttp2_stream *stream;
  char *reason;
  nghttp2_extpri extpri;
  nghttp2_priority_spec pri_spec;
  nghttp2_extpri local_34;
  nghttp2_priority_spec local_2c;
  
  if (session->server == '\0') {
    __assert_fail("session->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x14ce,
                  "int nghttp2_session_on_priority_update_received(nghttp2_session *, nghttp2_frame *)"
                 );
  }
  if ((frame->hd).stream_id != 0) {
    reason = "PRIORITY_UPDATE: stream_id == 0";
LAB_006169b7:
    iVar4 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
    return iVar4;
  }
  puVar2 = (uint *)(frame->ext).payload;
  uVar1 = *puVar2;
  if ((uVar1 & 1) == 0 && uVar1 != 0) {
    if ((int)uVar1 <= session->last_sent_stream_id) goto LAB_00616a7c;
    reason = "PRIORITY_UPDATE: prioritizing idle push is not allowed";
    goto LAB_006169b7;
  }
  stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,uVar1);
  if (stream == (nghttp2_stream *)0x0) {
    uVar1 = *puVar2;
    if (uVar1 == 0) goto LAB_00616a7c;
    if ((session->server == '\0') == (bool)((byte)uVar1 & 1)) {
      iVar4 = session->last_sent_stream_id;
    }
    else {
      iVar4 = session->last_recv_stream_id;
    }
    if ((int)uVar1 <= iVar4) goto LAB_00616a7c;
    if ((ulong)(session->local_settings).max_concurrent_streams <=
        session->num_incoming_streams + session->num_idle_streams) {
      reason = "PRIORITY_UPDATE: max concurrent streams exceeded";
      goto LAB_006169b7;
    }
    nghttp2_priority_spec_default_init(&local_2c);
    stream = nghttp2_session_open_stream
                       (session,*puVar2,'\0',&local_2c,NGHTTP2_STREAM_IDLE,(void *)0x0);
    if (stream == (nghttp2_stream *)0x0) {
      return -0x385;
    }
  }
  else if ((stream->flags & 0x20) != 0) goto LAB_00616a7c;
  local_34.urgency = 3;
  local_34.inc = 0;
  iVar4 = nghttp2_http_parse_priority(&local_34,*(uint8_t **)(puVar2 + 2),*(size_t *)(puVar2 + 4));
  if (iVar4 == 0) {
    u8extpri = nghttp2_extpri_to_uint8(&local_34);
    iVar4 = session_update_stream_priority(session,stream,u8extpri);
    if (iVar4 < -900) {
      return iVar4;
    }
  }
LAB_00616a7c:
  p_Var3 = (session->callbacks).on_frame_recv_callback;
  if ((p_Var3 != (nghttp2_on_frame_recv_callback)0x0) &&
     (iVar4 = (*p_Var3)(session,frame,session->user_data), iVar4 != 0)) {
    return -0x386;
  }
  return 0;
}

Assistant:

int nghttp2_session_on_priority_update_received(nghttp2_session *session,
                                                nghttp2_frame *frame) {
  nghttp2_ext_priority_update *priority_update;
  nghttp2_stream *stream;
  nghttp2_priority_spec pri_spec;
  nghttp2_extpri extpri;
  int rv;

  assert(session->server);

  priority_update = frame->ext.payload;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PRIORITY_UPDATE: stream_id == 0");
  }

  if (nghttp2_session_is_my_stream_id(session, priority_update->stream_id)) {
    if (session_detect_idle_stream(session, priority_update->stream_id)) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "PRIORITY_UPDATE: prioritizing idle push is not allowed");
    }

    /* TODO Ignore priority signal to a push stream for now */
    return session_call_on_frame_received(session, frame);
  }

  stream = nghttp2_session_get_stream_raw(session, priority_update->stream_id);
  if (stream) {
    /* Stream already exists. */
    if (stream->flags & NGHTTP2_STREAM_FLAG_IGNORE_CLIENT_PRIORITIES) {
      return session_call_on_frame_received(session, frame);
    }
  } else if (session_detect_idle_stream(session, priority_update->stream_id)) {
    if (session->num_idle_streams + session->num_incoming_streams >=
        session->local_settings.max_concurrent_streams) {
      return session_handle_invalid_connection(
          session, frame, NGHTTP2_ERR_PROTO,
          "PRIORITY_UPDATE: max concurrent streams exceeded");
    }

    nghttp2_priority_spec_default_init(&pri_spec);
    stream = nghttp2_session_open_stream(session, priority_update->stream_id,
                                         NGHTTP2_FLAG_NONE, &pri_spec,
                                         NGHTTP2_STREAM_IDLE, NULL);
    if (!stream) {
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    return session_call_on_frame_received(session, frame);
  }

  extpri.urgency = NGHTTP2_EXTPRI_DEFAULT_URGENCY;
  extpri.inc = 0;

  rv = nghttp2_http_parse_priority(&extpri, priority_update->field_value,
                                   priority_update->field_value_len);
  if (rv != 0) {
    /* Just ignore field_value if it cannot be parsed. */
    return session_call_on_frame_received(session, frame);
  }

  rv = session_update_stream_priority(session, stream,
                                      nghttp2_extpri_to_uint8(&extpri));
  if (rv != 0) {
    if (nghttp2_is_fatal(rv)) {
      return rv;
    }
  }

  return session_call_on_frame_received(session, frame);
}